

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O0

amqp_rpc_reply_t * amqp_connection_close(amqp_connection_state_t state,int code)

{
  uint in_EDX;
  amqp_rpc_reply_t *in_RDI;
  amqp_channel_close_t req;
  amqp_method_number_t replies [2];
  char codestr [13];
  undefined1 *decoded_request_method;
  uint in_stack_ffffffffffffffd4;
  amqp_method_number_t in_stack_ffffffffffffffd8;
  amqp_channel_t channel;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffe4;
  
  channel = 10;
  uVar1 = 0;
  if (((int)in_EDX < 0) || (0xffff < (int)in_EDX)) {
    amqp_rpc_reply_error(in_RDI,AMQP_STATUS_INVALID_PARAMETER);
  }
  else {
    decoded_request_method = &stack0xffffffffffffffe7;
    sprintf(&stack0xffffffffffffffe7,"%d",(ulong)in_EDX);
    amqp_simple_rpc((amqp_connection_state_t)CONCAT44(in_stack_ffffffffffffffe4,uVar1),channel,
                    in_stack_ffffffffffffffd8,
                    (amqp_method_number_t *)((ulong)in_stack_ffffffffffffffd4 << 0x20),
                    decoded_request_method);
  }
  return in_RDI;
}

Assistant:

amqp_rpc_reply_t amqp_connection_close(amqp_connection_state_t state,
                                       int code) {
  char codestr[13];
  amqp_method_number_t replies[2] = {AMQP_CONNECTION_CLOSE_OK_METHOD, 0};
  amqp_channel_close_t req;

  if (code < 0 || code > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }

  req.reply_code = (uint16_t)code;
  req.reply_text.bytes = codestr;
  req.reply_text.len = sprintf(codestr, "%d", code);
  req.class_id = 0;
  req.method_id = 0;

  return amqp_simple_rpc(state, 0, AMQP_CONNECTION_CLOSE_METHOD, replies, &req);
}